

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O2

void sortDecreasingHeap(HighsInt n,vector<double,_std::allocator<double>_> *heap_v,
                       vector<int,_std::allocator<int>_> *heap_ix)

{
  int *piVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  
  if (n < 2) {
    return;
  }
  piVar1 = (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar6 = ((uint)n >> 1) + 1;
  pdVar2 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (*piVar1 == 1) {
    uVar6 = 1;
  }
  uVar7 = (ulong)uVar6;
  do {
    if ((int)uVar7 < 2) {
      dVar10 = pdVar2[(uint)n];
      iVar8 = piVar1[(uint)n];
      pdVar2[(uint)n] = pdVar2[1];
      piVar1[(uint)n] = piVar1[1];
      n = n - 1;
      if (n == 1) {
        pdVar2[1] = dVar10;
        piVar1[1] = iVar8;
        return;
      }
      uVar7 = 1;
    }
    else {
      uVar7 = (ulong)((int)uVar7 - 1);
      dVar10 = pdVar2[uVar7];
      iVar8 = piVar1[uVar7];
    }
    pdVar3 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = uVar7;
    while( true ) {
      iVar4 = (int)uVar5;
      uVar6 = iVar4 * 2;
      uVar5 = (ulong)uVar6;
      if (n < (int)uVar6) break;
      lVar9 = (long)(int)uVar6;
      if ((int)uVar6 < n) {
        uVar6 = uVar6 | 1;
        if (pdVar3[(int)uVar6] <= pdVar3[lVar9] && pdVar3[lVar9] != pdVar3[(int)uVar6]) {
          uVar5 = (ulong)uVar6;
          lVar9 = (long)(int)uVar6;
        }
      }
      if (dVar10 <= pdVar3[lVar9]) break;
      pdVar3[iVar4] = pdVar3[lVar9];
      piVar1[iVar4] = piVar1[lVar9];
    }
    pdVar2[iVar4] = dVar10;
    piVar1[iVar4] = iVar8;
  } while( true );
}

Assistant:

void sortDecreasingHeap(const HighsInt n, vector<double>& heap_v,
                        vector<HighsInt>& heap_ix) {
  HighsInt fo_p, srt_p;
  HighsInt cd_p, pa_p;
  HighsInt ix;
  double v;
  if (n <= 1) return;
  if (heap_ix[0] != 1) {
    // The data are assumed to be completely unordered. A heap will be formed
    // and sorted.
    fo_p = n / 2 + 1;
    srt_p = n;
  } else {
    // The data are assumed to form a heap which is to be sorted.
    fo_p = 1;
    srt_p = n;
  }
  for (;;) {
    if (fo_p > 1) {
      fo_p = fo_p - 1;
      v = heap_v[fo_p];
      ix = heap_ix[fo_p];
    } else {
      v = heap_v[srt_p];
      ix = heap_ix[srt_p];
      heap_v[srt_p] = heap_v[1];
      heap_ix[srt_p] = heap_ix[1];
      srt_p--;
      if (srt_p == 1) {
        heap_v[1] = v;
        heap_ix[1] = ix;
        return;
      }
    }
    pa_p = fo_p;
    cd_p = fo_p + fo_p;
    for (;;) {
      if (cd_p <= srt_p) {
        if (cd_p < srt_p) {
          if (heap_v[cd_p] > heap_v[cd_p + 1]) cd_p = cd_p + 1;
        }
        if (v > heap_v[cd_p]) {
          heap_v[pa_p] = heap_v[cd_p];
          heap_ix[pa_p] = heap_ix[cd_p];
          pa_p = cd_p;
          cd_p = cd_p + cd_p;
          continue;
        }
      }
      break;
    }
    heap_v[pa_p] = v;
    heap_ix[pa_p] = ix;
  }
  return;
}